

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_parse_cookies_setcookie_str(FIOBJ dest,FIOBJ str,uint8_t is_url_encoded)

{
  size_t sVar1;
  char *local_48;
  char *cut2;
  char *cut;
  fio_str_info_s s;
  uint8_t is_url_encoded_local;
  FIOBJ str_local;
  FIOBJ dest_local;
  
  s.data._7_1_ = is_url_encoded;
  sVar1 = fiobj_type_is(str,FIOBJ_T_STRING);
  if (sVar1 != 0) {
    fiobj_obj2cstr((fio_str_info_s *)&cut,str);
    cut2 = (char *)memchr((void *)s.len,0x3d,s.capa);
    if (cut2 == (char *)0x0) {
      cut2 = (char *)s.len;
    }
    local_48 = (char *)memchr(cut2,0x3b,s.capa - ((long)cut2 - s.len));
    if (local_48 == (char *)0x0) {
      local_48 = (char *)(s.len + s.capa);
    }
    if (cut2 < local_48) {
      http_add2hash(dest,(char *)s.len,(long)cut2 - s.len,cut2 + 1,(long)local_48 - (long)(cut2 + 1)
                    ,s.data._7_1_);
    }
  }
  return;
}

Assistant:

static inline void http_parse_cookies_setcookie_str(FIOBJ dest, FIOBJ str,
                                                    uint8_t is_url_encoded) {
  if (!FIOBJ_TYPE_IS(str, FIOBJ_T_STRING))
    return;
  fio_str_info_s s = fiobj_obj2cstr(str);
  char *cut = memchr(s.data, '=', s.len);
  if (!cut)
    cut = s.data;
  char *cut2 = memchr(cut, ';', s.len - (cut - s.data));
  if (!cut2)
    cut2 = s.data + s.len;
  if (cut2 > cut)
    http_add2hash(dest, s.data, cut - s.data, cut + 1, (cut2 - (cut + 1)),
                  is_url_encoded);
}